

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

PathTypeSingleSuccessorInfo *
Js::PathTypeSingleSuccessorInfo::New
          (PathTypeSuccessorKey successorKey,RecyclerWeakReference<Js::DynamicType> *typeWeakRef,
          ScriptContext *scriptContext)

{
  Recycler *alloc;
  PathTypeSingleSuccessorInfo *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9d226db;
  data.filename._0_4_ = 0x85;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_48);
  this = (PathTypeSingleSuccessorInfo *)new<Memory::Recycler>(0x18,alloc,0x387914);
  PathTypeSingleSuccessorInfo(this,successorKey,typeWeakRef);
  return this;
}

Assistant:

PathTypeSingleSuccessorInfo * PathTypeSingleSuccessorInfo::New(const PathTypeSuccessorKey successorKey, RecyclerWeakReference<DynamicType> * typeWeakRef, ScriptContext * scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), PathTypeSingleSuccessorInfo, successorKey, typeWeakRef);
    }